

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interaction.h
# Opt level: O0

RayDifferential * __thiscall pbrt::Interaction::SpawnRay(Interaction *this,Vector3f *d)

{
  long in_RSI;
  RayDifferential *in_RDI;
  undefined1 in_ZMM0 [64];
  undefined1 auVar2 [56];
  undefined1 auVar1 [64];
  float fVar3;
  Point3f PVar4;
  Vector3f *in_stack_00000028;
  Interaction *in_stack_00000030;
  undefined4 in_stack_ffffffffffffffb0;
  MediumHandle *in_stack_ffffffffffffffc0;
  undefined8 uVar5;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 uVar6;
  undefined4 uVar7;
  float fVar8;
  
  auVar2 = in_ZMM0._8_56_;
  PVar4 = OffsetRayOrigin(in_stack_00000030,in_stack_00000028);
  fVar3 = PVar4.super_Tuple3<pbrt::Point3,_float>.z;
  auVar1._0_8_ = PVar4.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar1._8_56_ = auVar2;
  uVar5 = vmovlpd_avx(auVar1._0_16_);
  uVar6 = (undefined4)uVar5;
  uVar7 = (undefined4)((ulong)uVar5 >> 0x20);
  fVar8 = fVar3;
  GetMedium((Interaction *)in_RDI,
            (Vector3f *)CONCAT44(*(undefined4 *)(in_RSI + 0x18),in_stack_ffffffffffffffb0));
  RayDifferential::RayDifferential
            ((RayDifferential *)CONCAT44(fVar8,uVar7),
             (Point3f *)CONCAT44(uVar6,in_stack_ffffffffffffffd8),
             (Vector3f *)CONCAT44(in_stack_ffffffffffffffd4,fVar3),(Float)((ulong)uVar5 >> 0x20),
             in_stack_ffffffffffffffc0);
  return in_RDI;
}

Assistant:

SpawnRay(const Vector3f &d) const {
        return RayDifferential(OffsetRayOrigin(d), d, time, GetMedium(d));
    }